

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

void SimpleLogger::setCrashDumpPath(string *path,bool origin_only)

{
  int iVar1;
  undefined4 extraout_var;
  atomic<SimpleLoggerMgr_*> aVar2;
  
  aVar2._M_b._M_p = SimpleLoggerMgr::instance._M_b._M_p;
  if (SimpleLoggerMgr::instance._M_b._M_p == (__pointer_type)0x0) {
    iVar1 = SimpleLoggerMgr::init((EVP_PKEY_CTX *)path);
    aVar2._M_b._M_p = (__base_type)CONCAT44(extraout_var,iVar1);
  }
  if (aVar2._M_b._M_p != (__pointer_type)0x0) {
    std::__cxx11::string::_M_assign((string *)&((__pointer_type)aVar2._M_b._M_p)->crashDumpPath);
    ((__pointer_type)aVar2._M_b._M_p)->crashDumpOriginOnly = origin_only;
  }
  return;
}

Assistant:

void SimpleLogger::setCrashDumpPath(const std::string& path,
                                    bool origin_only)
{
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    if (mgr) {
        mgr->setCrashDumpPath(path, origin_only);
    }
}